

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool __thiscall ExpressionContext::IsGenericFunction(ExpressionContext *this,FunctionData *function)

{
  MatchData *local_28;
  MatchData *curr;
  FunctionData *function_local;
  ExpressionContext *this_local;
  
  if (((function->type->super_TypeBase).isGeneric & 1U) == 0) {
    if ((function->scope->ownerType == (TypeBase *)0x0) ||
       ((function->scope->ownerType->isGeneric & 1U) == 0)) {
      for (local_28 = (function->generics).head; local_28 != (MatchData *)0x0;
          local_28 = local_28->next) {
        if ((local_28->type->isGeneric & 1U) != 0) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ExpressionContext::IsGenericFunction(FunctionData *function)
{
	if(function->type->isGeneric)
		return true;

	if(function->scope->ownerType && function->scope->ownerType->isGeneric)
		return true;

	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		if(curr->type->isGeneric)
			return true;
	}

	return false;
}